

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

BSDF * __thiscall
pbrt::HairMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,BSDF *__return_storage_ptr__,HairMaterial *this,
          SampledWavelengths *param_5,undefined8 *param_6,undefined8 param_7,undefined8 param_8,
          undefined8 param_9,ulong param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14,undefined8 param_15,undefined8 param_16)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  ulong uVar1;
  uintptr_t iptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar11 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar17 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  SampledSpectrum c;
  UniversalTextureEvaluator local_13d;
  Float local_13c;
  Float local_138;
  uint local_134;
  Float local_130;
  Float local_12c;
  SampledSpectrum local_128;
  BxDFHandle local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  uintptr_t local_d8;
  uintptr_t local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined1 local_80 [32];
  DenselySampledSpectrum *pDStack_60;
  Float aFStack_58 [4];
  Float aFStack_48 [4];
  Float aFStack_38 [2];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_d0 = (this->beta_m).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx._8_8_ = param_10;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx._32_8_ = param_13;
  ctx._40_8_ = param_14;
  ctx._48_8_ = param_15;
  ctx._56_8_ = param_16;
  local_12c = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_d0,ctx);
  local_d8 = (this->beta_n).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_00._8_8_ = param_10;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_00._32_8_ = param_13;
  ctx_00._40_8_ = param_14;
  ctx_00._48_8_ = param_15;
  ctx_00._56_8_ = param_16;
  auVar4._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_13d,(FloatTextureHandle)&local_d8,ctx_00);
  auVar4._4_60_ = extraout_var;
  auVar2 = vmaxss_avx(auVar4._0_16_,ZEXT416(0x3c23d70a));
  local_e0 = (this->alpha).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_13c = auVar2._0_4_;
  ctx_01._8_8_ = param_10;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_01._32_8_ = param_13;
  ctx_01._40_8_ = param_14;
  ctx_01._48_8_ = param_15;
  ctx_01._56_8_ = param_16;
  local_130 = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_e0,ctx_01)
  ;
  local_e8 = (this->eta).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_02._8_8_ = param_10;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
  ctx_02._32_8_ = param_13;
  ctx_02._40_8_ = param_14;
  ctx_02._48_8_ = param_15;
  ctx_02._56_8_ = param_16;
  local_138 = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_e8,ctx_02)
  ;
  local_128.values.values._0_12_ = ZEXT812(0);
  local_128.values.values[3] = 0.0;
  uVar1 = (this->sigma_a).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) != 0) {
    local_a8 = *(undefined8 *)(param_5->lambda).values;
    uStack_a0 = *(undefined8 *)((param_5->lambda).values + 2);
    uStack_98 = *(undefined8 *)(param_5->pdf).values;
    uStack_90 = *(undefined8 *)((param_5->pdf).values + 2);
    auVar11 = ZEXT856(param_10);
    auVar17 = ZEXT856(param_2);
    ctx_03._8_8_ = param_10;
    ctx_03.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_03._32_8_ = param_13;
    ctx_03._40_8_ = param_14;
    ctx_03._48_8_ = param_15;
    ctx_03._56_8_ = param_16;
    local_f0 = uVar1;
    SVar18 = UniversalTextureEvaluator::operator()
                       (&local_13d,(SpectrumTextureHandle)&local_f0,ctx_03,*param_5);
    auVar13._0_8_ = SVar18.values.values._8_8_;
    auVar13._8_56_ = auVar17;
    auVar5._0_8_ = SVar18.values.values._0_8_;
    auVar5._8_56_ = auVar11;
    auVar2 = vmovlhps_avx(auVar5._0_16_,auVar13._0_16_);
    local_128.values.values = (array<float,_4>)vmaxps_avx(auVar2,_DAT_004a54e0);
    goto LAB_00364d5f;
  }
  uVar1 = (this->color).
          super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) == 0) {
    uVar1 = (this->eumelanin).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    if ((uVar1 & 0xffffffffffff) == 0) {
      uVar1 = (this->pheomelanin).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
      if ((uVar1 & 0xffffffffffff) == 0) {
        LogFatal<char_const(&)[25]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/materials.h"
                   ,0x175,"Check failed: %s",(char (*) [25])"eumelanin || pheomelanin");
      }
      auVar2 = ZEXT816(0) << 0x40;
LAB_00364cfa:
      local_134 = auVar2._0_4_;
      ctx_06._8_8_ = param_10;
      ctx_06.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
      ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
      ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
      ctx_06._32_8_ = param_13;
      ctx_06._40_8_ = param_14;
      ctx_06._48_8_ = param_15;
      ctx_06._56_8_ = param_16;
      local_108 = uVar1;
      auVar9._0_4_ = UniversalTextureEvaluator::operator()
                               (&local_13d,(FloatTextureHandle)&local_108,ctx_06);
      auVar9._4_60_ = extraout_var_01;
      auVar3 = auVar9._0_16_;
      auVar2 = ZEXT416(local_134);
    }
    else {
      ctx_05._8_8_ = param_10;
      ctx_05.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
      ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
      ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
      ctx_05._32_8_ = param_13;
      ctx_05._40_8_ = param_14;
      ctx_05._48_8_ = param_15;
      ctx_05._56_8_ = param_16;
      local_100 = uVar1;
      auVar8._0_4_ = UniversalTextureEvaluator::operator()
                               (&local_13d,(FloatTextureHandle)&local_100,ctx_05);
      auVar8._4_60_ = extraout_var_00;
      uVar1 = (this->pheomelanin).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
      auVar3._0_12_ = ZEXT412(0);
      auVar3._12_4_ = 0;
      auVar2 = vmaxss_avx(auVar8._0_16_,auVar3);
      if ((uVar1 & 0xffffffffffff) != 0) goto LAB_00364cfa;
    }
    auVar3 = vmaxss_avx(auVar3,ZEXT816(0) << 0x40);
    auVar17 = ZEXT856(auVar3._8_8_);
    auVar11 = ZEXT856(auVar2._8_8_);
    HairBxDF::SigmaAFromConcentration((RGBSpectrum *)local_80,auVar2._0_4_,auVar3._0_4_);
    SVar18 = RGBSpectrum::Sample((RGBSpectrum *)local_80,param_5);
    auVar16._0_8_ = SVar18.values.values._8_8_;
    auVar16._8_56_ = auVar17;
    auVar3 = auVar16._0_16_;
    auVar10._0_8_ = SVar18.values.values._0_8_;
    auVar10._8_56_ = auVar11;
    auVar2 = auVar10._0_16_;
  }
  else {
    local_c8 = *(undefined8 *)(param_5->lambda).values;
    uStack_c0 = *(undefined8 *)((param_5->lambda).values + 2);
    uStack_b8 = *(undefined8 *)(param_5->pdf).values;
    uStack_b0 = *(undefined8 *)((param_5->pdf).values + 2);
    auVar11 = ZEXT856(param_10);
    auVar17 = ZEXT856(param_2);
    ctx_04._8_8_ = param_10;
    ctx_04.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_9;
    ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_11;
    ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_12;
    ctx_04._32_8_ = param_13;
    ctx_04._40_8_ = param_14;
    ctx_04._48_8_ = param_15;
    ctx_04._56_8_ = param_16;
    local_f8 = uVar1;
    SVar18 = UniversalTextureEvaluator::operator()
                       (&local_13d,(SpectrumTextureHandle)&local_f8,ctx_04,*param_5);
    auVar14._0_8_ = SVar18.values.values._8_8_;
    auVar14._8_56_ = auVar17;
    auVar6._0_8_ = SVar18.values.values._0_8_;
    auVar6._8_56_ = auVar11;
    auVar2 = vmovlhps_avx(auVar6._0_16_,auVar14._0_16_);
    uVar1 = vcmpps_avx512vl(auVar2,ZEXT816(0) << 0x40,5);
    auVar12._8_4_ = 0x3f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar17 = ZEXT856(auVar12._8_8_);
    auVar2 = vminps_avx512vl(auVar12,auVar2);
    local_80._0_4_ = (uint)((byte)uVar1 & 1) * auVar2._0_4_;
    local_80._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar2._4_4_;
    local_80._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar2._8_4_;
    local_80._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar2._12_4_;
    auVar11 = (undefined1  [56])0x0;
    SVar18 = HairBxDF::SigmaAFromReflectance((SampledSpectrum *)local_80,local_13c,param_5);
    auVar15._0_8_ = SVar18.values.values._8_8_;
    auVar15._8_56_ = auVar17;
    auVar3 = auVar15._0_16_;
    auVar7._0_8_ = SVar18.values.values._0_8_;
    auVar7._8_56_ = auVar11;
    auVar2 = auVar7._0_16_;
  }
  local_128.values.values = (array<float,_4>)vmovlhps_avx(auVar2,auVar3);
LAB_00364d5f:
  auVar2 = vmaxss_avx(ZEXT416((uint)local_12c),ZEXT416(0x3c23d70a));
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)param_14),
                           ZEXT416(0xbf800000));
  HairBxDF::HairBxDF((HairBxDF *)local_80,auVar3._0_4_,local_138,&local_128,auVar2._0_4_,local_13c,
                     local_130);
  local_110.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_6 | 0x7000000000000);
  param_6[2] = local_80._16_8_;
  param_6[3] = local_80._24_8_;
  param_6[4] = pDStack_60;
  param_6[5] = aFStack_58._0_8_;
  param_6[6] = aFStack_58._8_8_;
  param_6[7] = aFStack_48._0_8_;
  param_6[8] = aFStack_48._8_8_;
  param_6[9] = aFStack_38;
  *param_6 = CONCAT44(local_80._4_4_,local_80._0_4_);
  param_6[1] = CONCAT44(local_80._12_4_,local_80._8_4_);
  param_6[2] = local_80._16_8_;
  param_6[3] = local_80._24_8_;
  param_6[4] = pDStack_60;
  param_6[5] = aFStack_58._0_8_;
  param_6[6] = aFStack_58._8_8_;
  param_6[7] = aFStack_48._0_8_;
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_110,local_138);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, HairBxDF *bxdf) const {
        Float bm = std::max<Float>(1e-2, texEval(beta_m, ctx));
        Float bn = std::max<Float>(1e-2, texEval(beta_n, ctx));
        Float a = texEval(alpha, ctx);
        Float e = texEval(eta, ctx);

        SampledSpectrum sig_a;
        if (sigma_a)
            sig_a = ClampZero(texEval(sigma_a, ctx, lambda));
        else if (color) {
            SampledSpectrum c = Clamp(texEval(color, ctx, lambda), 0, 1);
            sig_a = HairBxDF::SigmaAFromReflectance(c, bn, lambda);
        } else {
            CHECK(eumelanin || pheomelanin);
            sig_a = HairBxDF::SigmaAFromConcentration(
                        std::max(Float(0), eumelanin ? texEval(eumelanin, ctx) : 0),
                        std::max(Float(0), pheomelanin ? texEval(pheomelanin, ctx) : 0))
                        .Sample(lambda);
        }

        // Offset along width
        Float h = -1 + 2 * ctx.uv[1];
        *bxdf = HairBxDF(h, e, sig_a, bm, bn, a);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, e);
    }